

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sumInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ushort uVar1;
  Mem *pRec;
  double *pdVar2;
  i64 iVar3;
  sqlite3_value *pMem_00;
  Mem *pMem;
  double dVar4;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pdVar2 = (double *)createAggContext(context,0x20);
  }
  else {
    pdVar2 = (double *)context->pMem->z;
  }
  pRec = *argv;
  uVar1 = pRec->flags;
  if ((uVar1 & 0xf) == 2) {
    applyNumericAffinity(pRec,0);
    uVar1 = pRec->flags;
  }
  if ((pdVar2 != (double *)0x0) && ((0x55555555U >> (uVar1 & 0x1f) & 1) != 0)) {
    pdVar2[2] = (double)((long)pdVar2[2] + -1);
    if ((0x50505050U >> (uVar1 & 0x1f) & 1) == 0) {
      pMem_00 = *argv;
    }
    else {
      pMem_00 = *argv;
      if (*(char *)((long)pdVar2 + 0x19) == '\0') {
        iVar3 = sqlite3VdbeIntValue(pMem_00);
        *pdVar2 = *pdVar2 - (double)iVar3;
        pdVar2[1] = (double)((long)pdVar2[1] - iVar3);
        return;
      }
    }
    dVar4 = sqlite3VdbeRealValue(pMem_00);
    *pdVar2 = *pdVar2 - dVar4;
  }
  return;
}

Assistant:

static void sumInverse(sqlite3_context *context, int argc, sqlite3_value**argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  /* p is always non-NULL because sumStep() will have been called first
  ** to initialize it */
  if( ALWAYS(p) && type!=SQLITE_NULL ){
    assert( p->cnt>0 );
    p->cnt--;
    assert( type==SQLITE_INTEGER || p->approx );
    if( type==SQLITE_INTEGER && p->approx==0 ){
      i64 v = sqlite3_value_int64(argv[0]);
      p->rSum -= v;
      p->iSum -= v;
    }else{
      p->rSum -= sqlite3_value_double(argv[0]);
    }
  }
}